

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.h
# Opt level: O0

void __thiscall Decrypt::Decrypt(Decrypt *this,SequenceD<64> *k1,SequenceD<64> *k2)

{
  SequenceD<64> *k2_local;
  SequenceD<64> *k1_local;
  Decrypt *this_local;
  
  SequenceD<64>::SequenceD(&this->m_k1,k1);
  SequenceD<64>::SequenceD(&this->m_k2,k2);
  return;
}

Assistant:

Decrypt(SequenceD<64> &k1, SequenceD<64> &k2) : m_k1(k1), m_k2(k2){}